

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

int calculate_section_intra_ratio(FIRSTPASS_STATS *begin,FIRSTPASS_STATS *end,int section_length)

{
  double local_48;
  int i;
  double coded_error;
  double intra_error;
  FIRSTPASS_STATS *s;
  int section_length_local;
  FIRSTPASS_STATS *end_local;
  FIRSTPASS_STATS *begin_local;
  
  intra_error = 0.0;
  coded_error = 0.0;
  i = 0;
  for (s = begin; s < end && i < section_length; s = s + 1) {
    intra_error = s->intra_error + intra_error;
    coded_error = s->coded_error + coded_error;
    i = i + 1;
  }
  if (0.0 <= coded_error) {
    local_48 = coded_error + 1e-06;
  }
  else {
    local_48 = coded_error - 1e-06;
  }
  return (int)(intra_error / local_48);
}

Assistant:

static int calculate_section_intra_ratio(const FIRSTPASS_STATS *begin,
                                         const FIRSTPASS_STATS *end,
                                         int section_length) {
  const FIRSTPASS_STATS *s = begin;
  double intra_error = 0.0;
  double coded_error = 0.0;
  int i = 0;

  while (s < end && i < section_length) {
    intra_error += s->intra_error;
    coded_error += s->coded_error;
    ++s;
    ++i;
  }

  return (int)(intra_error / DOUBLE_DIVIDE_CHECK(coded_error));
}